

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O1

bool __thiscall pg::PPSolver::setupRegion(PPSolver *this,int i,int p,bool mustReset)

{
  ulong *puVar1;
  vector<int,std::allocator<int>> *this_00;
  uint uVar2;
  int iVar3;
  int *piVar4;
  bitset *pbVar5;
  uint64_t *puVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  size_t sVar8;
  iterator __position;
  pointer piVar9;
  bool bVar10;
  long lVar11;
  undefined7 in_register_00000009;
  ulong uVar12;
  int *piVar13;
  pointer piVar14;
  ulong uVar15;
  int *piVar16;
  ulong uVar17;
  int *piVar18;
  long lVar19;
  ulong uVar20;
  uint local_3c;
  long local_38;
  
  uVar17 = CONCAT71(in_register_00000009,mustReset);
  uVar15 = (ulong)(uint)i;
  lVar11 = (long)p;
  if ((int)uVar17 == 0) {
    piVar13 = this->regions[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar4 = this->regions[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar13 != piVar4) {
      pbVar5 = (this->super_Solver).disabled;
      piVar18 = this->region;
      puVar6 = (this->Z)._bits;
      uVar20 = uVar17 & 0xffffffff;
      do {
        piVar16 = piVar13 + 1;
        uVar12 = (ulong)*piVar13;
        uVar2 = piVar18[uVar12];
        if (uVar2 == p) {
          puVar1 = puVar6 + (uVar12 >> 6);
          *puVar1 = *puVar1 | 1L << (uVar12 & 0x3f);
          goto LAB_0015bd13;
        }
        bVar10 = true;
        if ((int)uVar2 < p) {
          uVar17 = 1;
        }
        else {
          uVar17 = 1;
          if ((1L << (uVar12 & 0x3f) & pbVar5->_bits[uVar12 >> 6]) == 0) {
            if (p < (int)uVar2) {
              bVar10 = true;
              uVar17 = 1;
              if (((uVar2 ^ p) & 1) != 0) goto LAB_0015bd19;
            }
LAB_0015bd13:
            bVar10 = false;
            uVar17 = uVar20;
          }
        }
LAB_0015bd19:
        local_38 = lVar11;
      } while ((!bVar10) && (uVar20 = uVar17, piVar13 = piVar16, piVar16 != piVar4));
    }
  }
  pvVar7 = this->regions;
  piVar13 = pvVar7[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar4 = pvVar7[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((uVar17 & 1) != 0) {
    if (piVar13 != piVar4) {
      resetRegion(this,p);
    }
    sVar8 = (this->Z)._bitssize;
    if (sVar8 != 0) {
      memset((this->Z)._bits,0,sVar8 << 3);
    }
    goto LAB_0015bf29;
  }
  lVar19 = (long)piVar4 - (long)piVar13 >> 4;
  piVar18 = piVar13;
  if (0 < lVar19) {
    puVar6 = (this->Z)._bits;
    piVar18 = (int *)(((long)piVar4 - (long)piVar13 & 0xfffffffffffffff0U) + (long)piVar13);
    lVar19 = lVar19 + 1;
    piVar13 = piVar13 + 2;
    do {
      if ((puVar6[(ulong)(long)piVar13[-2] >> 6] >> ((long)piVar13[-2] & 0x3fU) & 1) == 0) {
        piVar13 = piVar13 + -2;
        goto LAB_0015bed4;
      }
      if ((puVar6[(ulong)(long)piVar13[-1] >> 6] >> ((long)piVar13[-1] & 0x3fU) & 1) == 0) {
        piVar13 = piVar13 + -1;
        goto LAB_0015bed4;
      }
      if ((puVar6[(ulong)(long)*piVar13 >> 6] >> ((long)*piVar13 & 0x3fU) & 1) == 0)
      goto LAB_0015bed4;
      if ((puVar6[(ulong)(long)piVar13[1] >> 6] >> ((long)piVar13[1] & 0x3fU) & 1) == 0) {
        piVar13 = piVar13 + 1;
        goto LAB_0015bed4;
      }
      lVar19 = lVar19 + -1;
      piVar13 = piVar13 + 4;
    } while (1 < lVar19);
  }
  lVar19 = (long)piVar4 - (long)piVar18 >> 2;
  if (lVar19 == 1) {
LAB_0015bea5:
    piVar13 = piVar18;
    if (((this->Z)._bits[(ulong)(long)*piVar18 >> 6] >> ((long)*piVar18 & 0x3fU) & 1) != 0) {
      piVar13 = piVar4;
    }
  }
  else if (lVar19 == 2) {
LAB_0015be89:
    piVar13 = piVar18;
    if (((this->Z)._bits[(ulong)(long)*piVar18 >> 6] >> ((long)*piVar18 & 0x3fU) & 1) != 0) {
      piVar18 = piVar18 + 1;
      goto LAB_0015bea5;
    }
  }
  else {
    piVar13 = piVar4;
    if ((lVar19 == 3) &&
       (piVar13 = piVar18,
       ((this->Z)._bits[(ulong)(long)*piVar18 >> 6] >> ((long)*piVar18 & 0x3fU) & 1) != 0)) {
      piVar18 = piVar18 + 1;
      goto LAB_0015be89;
    }
  }
LAB_0015bed4:
  if ((piVar13 != piVar4) && (piVar18 = piVar13 + 1, piVar18 != piVar4)) {
    puVar6 = (this->Z)._bits;
    do {
      iVar3 = *piVar18;
      if ((puVar6[(ulong)(long)iVar3 >> 6] >> ((long)iVar3 & 0x3fU) & 1) != 0) {
        *piVar13 = iVar3;
        piVar13 = piVar13 + 1;
      }
      piVar18 = piVar18 + 1;
    } while (piVar18 != piVar4);
  }
  if (piVar13 != piVar4) {
    piVar9 = pvVar7[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar14 = (pointer)((long)piVar13 + ((long)piVar9 - (long)piVar4));
    if (piVar9 != piVar14) {
      pvVar7[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar14;
    }
  }
LAB_0015bf29:
  local_3c = i;
  if (-1 < i) {
    local_3c = i;
    do {
      if (((this->super_Solver).game)->_priority[uVar15] != p) break;
      iVar3 = this->region[uVar15];
      if (iVar3 != -2) {
        if ((((this->super_Solver).disabled)->_bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
          if (iVar3 == p) {
            puVar6 = (this->Z)._bits;
            if ((puVar6[uVar15 >> 6] & 1L << (uVar15 & 0x3f)) == 0) {
              this_00 = (vector<int,std::allocator<int>> *)(this->regions + lVar11);
              __position._M_current = *(int **)(this_00 + 8);
              if (__position._M_current == *(int **)(this_00 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this_00,__position,(int *)&local_3c);
              }
              else {
                *__position._M_current = (int)uVar15;
                *(int **)(this_00 + 8) = __position._M_current + 1;
              }
              this->strategy[(int)local_3c] = -1;
            }
            else {
              uVar17 = (ulong)this->strategy[uVar15];
              if ((uVar17 != 0xffffffffffffffff) &&
                 ((puVar6[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) == 0)) {
                this->strategy[uVar15] = -1;
              }
            }
          }
        }
        else {
          this->region[uVar15] = -2;
        }
      }
      uVar2 = local_3c - 1;
      uVar15 = (ulong)uVar2;
      bVar10 = 0 < (int)local_3c;
      local_3c = uVar2;
    } while (bVar10);
  }
  sVar8 = (this->Z)._bitssize;
  if (sVar8 != 0) {
    memset((this->Z)._bits,0,sVar8 << 3);
  }
  piVar9 = this->regions[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar14 = this->regions[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (piVar9 != piVar14) {
    attract(this,p);
  }
  return piVar9 != piVar14;
}

Assistant:

bool
PPSolver::setupRegion(int i, int p, bool mustReset)
{
    // NOTE: a node can be "disabled" and in a region (after dominion attraction)
    
    if (!mustReset) {
        // Check if we must reset anyway (because region is tainted)
        // When must a region be reset?
        // - some vertices are in a dominion (now disabled)
        // - some vertices are already reset (i.e., attracted by opponent, then reset)
        // - some vertices are attracted to a higher OPPONENT region
        // When does a region not need to be reset?
        // - some vertices are attracted to a higher SAME-PARITY region
        for (int i : regions[p]) {
            if (region[i] == p) {
                Z[i] = true;
            } else if (disabled[i] or region[i] < p or (region[i] > p and (region[i]&1) != (p&1))) {
                mustReset = true;
                break;
            }
        }
    }

    if (mustReset) {
        if (!regions[p].empty()) resetRegion(p);
        Z.reset();
    } else {
        // No reset, but remove escapes (to be added) and remove things in a higher region...
        // The reason is that there may be vertices of priority p that are not yet in the region vector
        regions[p].erase(std::remove_if(regions[p].begin(), regions[p].end(),
                [&](const int x){ return Z[x] != 1; }),
                regions[p].end());
    }

    // Add all escapes to regions vector
    for (int j=i; j>=0 && priority(j) == p; j--) {
        if (region[j] == -2) continue; // already known to be disabled
        else if (disabled[j]) region[j] = -2; // set now to region -2
        else if (region[j] == p) { // is [to be] in region!
            if (Z[j]) {
                // already in the region, but check strategy
                if (strategy[j] != -1 and !Z[strategy[j]]) strategy[j] = -1;
                continue;
            } else {
                regions[p].push_back(j);
                strategy[j] = -1;
            }
        }
    }

    Z.reset();

    // If the region is empty, return false
    if (regions[p].empty()) return false;

    // Otherwise, attract and return true
    attract(p);
    return true;
}